

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.c
# Opt level: O0

LY_ERR lyd_diff_siblings_r(lyd_node *first,lyd_node *second,uint16_t options,ly_bool nosiblings,
                          lyd_node **diff)

{
  lyd_node *first_00;
  lyd_node *second_00;
  lyd_node **local_108;
  ly_ctx *local_f8;
  lyd_node **local_f0;
  ly_ctx *local_d8;
  char *local_d0;
  char *orig_position;
  char *orig_key;
  char *position;
  char *value;
  char *key;
  char *orig_value;
  char *orig_default;
  lyd_node **pplStack_90;
  lyd_diff_op op;
  uint64_t u;
  ly_ht *dup_inst_second;
  ly_ht *dup_inst_first;
  lyd_diff_userord *userord_item;
  lyd_diff_userord *userord;
  lyd_node *match_first;
  lyd_node *match_second;
  lyd_node *iter_second;
  lyd_node *iter_first;
  lyd_node **pplStack_40;
  LY_ERR ret;
  lyd_node **diff_local;
  ly_bool nosiblings_local;
  lyd_node *plStack_30;
  uint16_t options_local;
  lyd_node *second_local;
  lyd_node *first_local;
  
  iter_first._4_4_ = LY_SUCCESS;
  userord_item = (lyd_diff_userord *)0x0;
  dup_inst_second = (ly_ht *)0x0;
  u = 0;
  pplStack_40 = diff;
  diff_local._5_1_ = nosiblings;
  diff_local._6_2_ = options;
  plStack_30 = second;
  second_local = first;
  for (iter_second = first; iter_second != (lyd_node *)0x0; iter_second = iter_second->next) {
    if (iter_second->schema != (lysc_node *)0x0) {
      if ((iter_second->schema->flags & 0x100) != 0) {
        __assert_fail("!(iter_first->schema->flags & LYS_KEY)",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c"
                      ,0x3a9,
                      "LY_ERR lyd_diff_siblings_r(const struct lyd_node *, const struct lyd_node *, uint16_t, ly_bool, struct lyd_node **)"
                     );
      }
      if (((iter_second->flags & 1) == 0) || ((diff_local._6_2_ & 1) != 0)) {
        iter_first._4_4_ =
             lyd_diff_find_match(plStack_30,iter_second,(byte)diff_local._6_2_ & 1,(ly_ht **)&u,
                                 &match_first);
        if (iter_first._4_4_ != LY_SUCCESS) goto LAB_0011f1f4;
        if (((iter_second->schema == (lysc_node *)0x0) ||
            ((iter_second->schema->nodetype & 0x18) == 0)) ||
           ((iter_second->schema->flags & 0x40) == 0)) {
          iter_first._4_4_ =
               lyd_diff_attrs(iter_second,match_first,diff_local._6_2_,
                              (lyd_diff_op *)((long)&orig_default + 4),&orig_value,&key);
          if (iter_first._4_4_ == LY_SUCCESS) {
            if (orig_default._4_4_ == LYD_DIFF_OP_DELETE) {
              iter_first._4_4_ =
                   lyd_diff_add(iter_second,LYD_DIFF_OP_DELETE,orig_value,key,(char *)0x0,
                                (char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0,pplStack_40);
            }
            else {
              if (match_first == (lyd_node *)0x0) {
                __assert_fail("match_second",
                              "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c"
                              ,0x3d4,
                              "LY_ERR lyd_diff_siblings_r(const struct lyd_node *, const struct lyd_node *, uint16_t, ly_bool, struct lyd_node **)"
                             );
              }
              iter_first._4_4_ =
                   lyd_diff_add(match_first,orig_default._4_4_,orig_value,key,(char *)0x0,
                                (char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0,pplStack_40);
            }
            free(key);
joined_r0x0011ed57:
            if (iter_first._4_4_ != LY_SUCCESS) goto LAB_0011f1f4;
          }
          else {
            if (iter_first._4_4_ != LY_ENOT) goto LAB_0011f1f4;
            iter_first._4_4_ = LY_SUCCESS;
          }
        }
        else {
          dup_inst_first =
               (ly_ht *)lyd_diff_userord_get(iter_second,iter_second->schema,&userord_item);
          if (dup_inst_first == (ly_ht *)0x0) {
            if (iter_second->schema == (lysc_node *)0x0) {
              local_d8 = (ly_ctx *)iter_second[2].schema;
            }
            else {
              local_d8 = iter_second->schema->module->ctx;
            }
            ly_log(local_d8,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                   "lyd_diff_siblings_r");
            iter_first._4_4_ = LY_EMEM;
            goto LAB_0011f1f4;
          }
          if (match_first == (lyd_node *)0x0) {
            iter_first._4_4_ =
                 lyd_diff_userord_attrs
                           (iter_second,(lyd_node *)0x0,diff_local._6_2_,
                            (lyd_diff_userord *)dup_inst_first,
                            (lyd_diff_op *)((long)&orig_default + 4),&orig_value,&position,&key,
                            &value,&orig_position,&orig_key,&local_d0);
            if (iter_first._4_4_ == LY_SUCCESS) {
              if (orig_default._4_4_ != LYD_DIFF_OP_DELETE) {
                __assert_fail("op == LYD_DIFF_OP_DELETE",
                              "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c"
                              ,0x3bf,
                              "LY_ERR lyd_diff_siblings_r(const struct lyd_node *, const struct lyd_node *, uint16_t, ly_bool, struct lyd_node **)"
                             );
              }
              iter_first._4_4_ =
                   lyd_diff_add(iter_second,LYD_DIFF_OP_DELETE,orig_value,key,value,position,
                                orig_key,orig_position,local_d0,pplStack_40);
              free(key);
              free(value);
              free(position);
              free(orig_key);
              free(orig_position);
              free(local_d0);
              goto joined_r0x0011ed57;
            }
            goto LAB_0011f1f4;
          }
        }
        if (match_first != (lyd_node *)0x0) {
          first_00 = lyd_child_no_keys(iter_second);
          second_00 = lyd_child_no_keys(match_first);
          iter_first._4_4_ =
               lyd_diff_siblings_r(first_00,second_00,diff_local._6_2_,'\0',pplStack_40);
          if (iter_first._4_4_ != LY_SUCCESS) goto LAB_0011f1f4;
        }
        if (diff_local._5_1_ != '\0') break;
      }
    }
  }
  pplStack_90 = (lyd_node **)0x0;
  while( true ) {
    if (userord_item == (lyd_diff_userord *)0x0) {
      local_f0 = (lyd_node **)0x0;
    }
    else {
      local_f0 = userord_item[-1].inst;
    }
    if (local_f0 <= pplStack_90) break;
    userord_item[(long)pplStack_90].pos = 0;
    pplStack_90 = (lyd_node **)((long)pplStack_90 + 1);
  }
  match_second = plStack_30;
  do {
    if (match_second == (lyd_node *)0x0) {
LAB_0011f1f4:
      lyd_dup_inst_free(dup_inst_second);
      lyd_dup_inst_free((ly_ht *)u);
      pplStack_90 = (lyd_node **)0x0;
      while( true ) {
        if (userord_item == (lyd_diff_userord *)0x0) {
          local_108 = (lyd_node **)0x0;
        }
        else {
          local_108 = userord_item[-1].inst;
        }
        if (local_108 <= pplStack_90) break;
        if (userord_item[(long)pplStack_90].inst != (lyd_node **)0x0) {
          free(userord_item[(long)pplStack_90].inst + -1);
        }
        pplStack_90 = (lyd_node **)((long)pplStack_90 + 1);
      }
      if (userord_item != (lyd_diff_userord *)0x0) {
        free(&userord_item[-1].inst);
      }
      return iter_first._4_4_;
    }
    if (match_second->schema != (lysc_node *)0x0) {
      if ((match_second->schema->flags & 0x100) != 0) {
        __assert_fail("!(iter_second->schema->flags & LYS_KEY)",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c"
                      ,0x3f7,
                      "LY_ERR lyd_diff_siblings_r(const struct lyd_node *, const struct lyd_node *, uint16_t, ly_bool, struct lyd_node **)"
                     );
      }
      if (((match_second->flags & 1) == 0) || ((diff_local._6_2_ & 1) != 0)) {
        iter_first._4_4_ =
             lyd_diff_find_match(second_local,match_second,(byte)diff_local._6_2_ & 1,
                                 &dup_inst_second,(lyd_node **)&userord);
        if (iter_first._4_4_ != LY_SUCCESS) goto LAB_0011f1f4;
        if (((match_second->schema == (lysc_node *)0x0) ||
            ((match_second->schema->nodetype & 0x18) == 0)) ||
           ((match_second->schema->flags & 0x40) == 0)) {
          if (userord == (lyd_diff_userord *)0x0) {
            iter_first._4_4_ =
                 lyd_diff_attrs((lyd_node *)0x0,match_second,diff_local._6_2_,
                                (lyd_diff_op *)((long)&orig_default + 4),&orig_value,&key);
            if (iter_first._4_4_ != LY_SUCCESS) goto LAB_0011f1f4;
            if (orig_default._4_4_ != LYD_DIFF_OP_CREATE) {
              __assert_fail("op == LYD_DIFF_OP_CREATE",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c"
                            ,0x420,
                            "LY_ERR lyd_diff_siblings_r(const struct lyd_node *, const struct lyd_node *, uint16_t, ly_bool, struct lyd_node **)"
                           );
            }
            iter_first._4_4_ =
                 lyd_diff_add(match_second,LYD_DIFF_OP_CREATE,orig_value,key,(char *)0x0,(char *)0x0
                              ,(char *)0x0,(char *)0x0,(char *)0x0,pplStack_40);
            free(key);
joined_r0x0011f1cf:
            if (iter_first._4_4_ != LY_SUCCESS) goto LAB_0011f1f4;
          }
        }
        else {
          dup_inst_first =
               (ly_ht *)lyd_diff_userord_get((lyd_node *)userord,match_second->schema,&userord_item)
          ;
          if (dup_inst_first == (ly_ht *)0x0) {
            if (match_second->schema == (lysc_node *)0x0) {
              local_f8 = (ly_ctx *)match_second[2].schema;
            }
            else {
              local_f8 = match_second->schema->module->ctx;
            }
            ly_log(local_f8,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                   "lyd_diff_siblings_r");
            iter_first._4_4_ = LY_EMEM;
            goto LAB_0011f1f4;
          }
          iter_first._4_4_ =
               lyd_diff_userord_attrs
                         ((lyd_node *)userord,match_second,diff_local._6_2_,
                          (lyd_diff_userord *)dup_inst_first,
                          (lyd_diff_op *)((long)&orig_default + 4),&orig_value,&position,&key,&value
                          ,&orig_position,&orig_key,&local_d0);
          if (iter_first._4_4_ == LY_SUCCESS) {
            iter_first._4_4_ =
                 lyd_diff_add(match_second,orig_default._4_4_,orig_value,key,value,position,orig_key
                              ,orig_position,local_d0,pplStack_40);
            free(key);
            free(value);
            free(position);
            free(orig_key);
            free(orig_position);
            free(local_d0);
            goto joined_r0x0011f1cf;
          }
          if (iter_first._4_4_ != LY_ENOT) goto LAB_0011f1f4;
          iter_first._4_4_ = LY_SUCCESS;
        }
        if (diff_local._5_1_ != '\0') goto LAB_0011f1f4;
      }
    }
    match_second = match_second->next;
  } while( true );
}

Assistant:

static LY_ERR
lyd_diff_siblings_r(const struct lyd_node *first, const struct lyd_node *second, uint16_t options, ly_bool nosiblings,
        struct lyd_node **diff)
{
    LY_ERR ret = LY_SUCCESS;
    const struct lyd_node *iter_first, *iter_second;
    struct lyd_node *match_second, *match_first;
    struct lyd_diff_userord *userord = NULL, *userord_item;
    struct ly_ht *dup_inst_first = NULL, *dup_inst_second = NULL;
    LY_ARRAY_COUNT_TYPE u;
    enum lyd_diff_op op;
    const char *orig_default;
    char *orig_value, *key, *value, *position, *orig_key, *orig_position;

    /* compare first tree to the second tree - delete, replace, none */
    LY_LIST_FOR(first, iter_first) {
        if (!iter_first->schema) {
            continue;
        }

        assert(!(iter_first->schema->flags & LYS_KEY));
        if ((iter_first->flags & LYD_DEFAULT) && !(options & LYD_DIFF_DEFAULTS)) {
            /* skip default nodes */
            continue;
        }

        /* find a match in the second tree */
        LY_CHECK_GOTO(ret = lyd_diff_find_match(second, iter_first, options & LYD_DIFF_DEFAULTS, &dup_inst_second,
                &match_second), cleanup);

        if (lysc_is_userordered(iter_first->schema)) {
            /* get (create) userord entry */
            userord_item = lyd_diff_userord_get(iter_first, iter_first->schema, &userord);
            LY_CHECK_ERR_GOTO(!userord_item, LOGMEM(LYD_CTX(iter_first)); ret = LY_EMEM, cleanup);

            /* we are handling only user-ordered node delete now */
            if (!match_second) {
                /* get all the attributes */
                LY_CHECK_GOTO(ret = lyd_diff_userord_attrs(iter_first, match_second, options, userord_item, &op,
                        &orig_default, &value, &orig_value, &key, &orig_key, &position, &orig_position), cleanup);

                /* there must be changes, it is deleted */
                assert(op == LYD_DIFF_OP_DELETE);
                ret = lyd_diff_add(iter_first, op, orig_default, orig_value, key, value, position, orig_key,
                        orig_position, diff);

                free(orig_value);
                free(key);
                free(value);
                free(position);
                free(orig_key);
                free(orig_position);
                LY_CHECK_GOTO(ret, cleanup);
            }
        } else {
            /* get all the attributes */
            ret = lyd_diff_attrs(iter_first, match_second, options, &op, &orig_default, &orig_value);

            /* add into diff if there are any changes */
            if (!ret) {
                if (op == LYD_DIFF_OP_DELETE) {
                    ret = lyd_diff_add(iter_first, op, orig_default, orig_value, NULL, NULL, NULL, NULL, NULL, diff);
                } else {
                    assert(match_second);
                    ret = lyd_diff_add(match_second, op, orig_default, orig_value, NULL, NULL, NULL, NULL, NULL, diff);
                }

                free(orig_value);
                LY_CHECK_GOTO(ret, cleanup);
            } else if (ret == LY_ENOT) {
                ret = LY_SUCCESS;
            } else {
                goto cleanup;
            }
        }

        /* check descendants, if any, recursively */
        if (match_second) {
            LY_CHECK_GOTO(ret = lyd_diff_siblings_r(lyd_child_no_keys(iter_first), lyd_child_no_keys(match_second),
                    options, 0, diff), cleanup);
        }

        if (nosiblings) {
            break;
        }
    }

    /* reset all cached positions */
    LY_ARRAY_FOR(userord, u) {
        userord[u].pos = 0;
    }

    /* compare second tree to the first tree - create, user-ordered move */
    LY_LIST_FOR(second, iter_second) {
        if (!iter_second->schema) {
            continue;
        }

        assert(!(iter_second->schema->flags & LYS_KEY));
        if ((iter_second->flags & LYD_DEFAULT) && !(options & LYD_DIFF_DEFAULTS)) {
            /* skip default nodes */
            continue;
        }

        /* find a match in the first tree */
        LY_CHECK_GOTO(ret = lyd_diff_find_match(first, iter_second, options & LYD_DIFF_DEFAULTS, &dup_inst_first,
                &match_first), cleanup);

        if (lysc_is_userordered(iter_second->schema)) {
            /* get userord entry */
            userord_item = lyd_diff_userord_get(match_first, iter_second->schema, &userord);
            LY_CHECK_ERR_GOTO(!userord_item, LOGMEM(LYD_CTX(iter_second)); ret = LY_EMEM, cleanup);

            /* get all the attributes */
            ret = lyd_diff_userord_attrs(match_first, iter_second, options, userord_item, &op, &orig_default,
                    &value, &orig_value, &key, &orig_key, &position, &orig_position);

            /* add into diff if there are any changes */
            if (!ret) {
                ret = lyd_diff_add(iter_second, op, orig_default, orig_value, key, value, position, orig_key,
                        orig_position, diff);

                free(orig_value);
                free(key);
                free(value);
                free(position);
                free(orig_key);
                free(orig_position);
                LY_CHECK_GOTO(ret, cleanup);
            } else if (ret == LY_ENOT) {
                ret = LY_SUCCESS;
            } else {
                goto cleanup;
            }
        } else if (!match_first) {
            /* get all the attributes */
            LY_CHECK_GOTO(ret = lyd_diff_attrs(match_first, iter_second, options, &op, &orig_default, &orig_value), cleanup);

            /* there must be changes, it is created */
            assert(op == LYD_DIFF_OP_CREATE);
            ret = lyd_diff_add(iter_second, op, orig_default, orig_value, NULL, NULL, NULL, NULL, NULL, diff);

            free(orig_value);
            LY_CHECK_GOTO(ret, cleanup);
        } /* else was handled */

        if (nosiblings) {
            break;
        }
    }

cleanup:
    lyd_dup_inst_free(dup_inst_first);
    lyd_dup_inst_free(dup_inst_second);
    LY_ARRAY_FOR(userord, u) {
        LY_ARRAY_FREE(userord[u].inst);
    }
    LY_ARRAY_FREE(userord);
    return ret;
}